

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

IndexedMatrixArray * __thiscall
stateObservation::tools::Logger::getRecord(Logger *this,void *address)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator i;
  void *address_local;
  Logger *this_local;
  
  i._M_node = (_Base_ptr)address;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<const_void_*,_stateObservation::tools::Logger::log_s,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>_>
       ::find(&this->logs_,&i._M_node);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_void_*,_stateObservation::tools::Logger::log_s,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>_>
       ::end(&this->logs_);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>
             ::operator->(&local_20);
    return (IndexedMatrixArray *)&ppVar2->second;
  }
  __assert_fail("false && \"The logger cannot find the data, please use record function\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/logger.cpp"
                ,0x3b,"IndexedMatrixArray &stateObservation::tools::Logger::getRecord(const void *)"
               );
}

Assistant:

IndexedMatrixArray & Logger::getRecord(const void* address)
    {
      Tmap::iterator i= logs_.find(address);
      if (i==logs_.end())
      {
        BOOST_ASSERT(false && "The logger cannot find the data, please use record function");
        throw std::invalid_argument
                ("The logger cannot find the data, please use record function");
      }
      else
        return i->second.array;
    }